

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::clear
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,bool dispose)

{
  int *piVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < (this->heap).sz; lVar2 = lVar2 + 1) {
    piVar1 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&this->indices,(this->heap).data[lVar2]);
    *piVar1 = -1;
  }
  vec<int,_int>::clear(&this->heap,dispose);
  return;
}

Assistant:

void clear(bool dispose = false) 
    { 
        // TODO: shouldn't the 'indices' map also be dispose-cleared?
        for (int i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear(dispose); 
    }